

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

deUint32 __thiscall glu::sl::ShaderParser::getGLEnumFromName(ShaderParser *this,string *enumName)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  string *psStack_20;
  int ndx;
  string *enumName_local;
  ShaderParser *this_local;
  
  local_24 = 0;
  psStack_20 = enumName;
  enumName_local = (string *)this;
  while( true ) {
    if (3 < local_24) {
      std::__cxx11::string::string((string *)&local_88);
      std::operator+(&local_68,&local_88,"unknown enum name, got ");
      std::operator+(&local_48,&local_68,psStack_20);
      parseError(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      return 0;
    }
    bVar1 = std::operator==(getGLEnumFromName::names[local_24].name,psStack_20);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return getGLEnumFromName::names[local_24].value;
}

Assistant:

deUint32 ShaderParser::getGLEnumFromName (const std::string& enumName)
{
	static const struct
	{
		const char*	name;
		deUint32	value;
	} names[] =
	{
		{ "GL_MAX_VERTEX_IMAGE_UNIFORMS",			GL_MAX_VERTEX_IMAGE_UNIFORMS			},
		{ "GL_MAX_VERTEX_ATOMIC_COUNTERS",			GL_MAX_VERTEX_ATOMIC_COUNTERS			},
		{ "GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS",	GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS		},
		{ "GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS",	GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(names); ++ndx)
		if (names[ndx].name == enumName)
			return names[ndx].value;

	parseError(std::string() + "unknown enum name, got " + enumName);
	return 0;
}